

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O2

bool detectWebBrowser(QByteArray *desktop,bool checkBrowserVariable,QString *browser)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  bool bVar6;
  size_t i;
  long lVar7;
  long in_FS_OFFSET;
  QLatin1StringView local_a8;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  char *browsers [4];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  browsers[0] = "google-chrome";
  browsers[1] = "firefox";
  browsers[2] = "mozilla";
  browsers[3] = "opera";
  QString::clear(browser);
  local_78.d = (Data *)0x0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_78.ptr = L"xdg-open";
  local_98.size = 0;
  local_78.size = 8;
  bVar5 = checkExecutable((QString *)&local_78,browser);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  bVar6 = true;
  if (bVar5) goto LAB_0057e064;
  if (checkBrowserVariable) {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    qEnvironmentVariable((char *)&local_78);
    if ((undefined1 *)local_78.size == (undefined1 *)0x0) {
      qEnvironmentVariable((char *)&local_98);
      qVar4 = local_78.size;
      pcVar3 = local_78.ptr;
      pDVar2 = local_78.d;
      local_78.d = local_98.d;
      local_78.ptr = local_98.ptr;
      local_98.d = pDVar2;
      local_98.ptr = pcVar3;
      local_78.size = local_98.size;
      local_98.size = qVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      if ((undefined1 *)local_78.size != (undefined1 *)0x0) goto LAB_0057e119;
    }
    else {
LAB_0057e119:
      bVar5 = checkExecutable((QString *)&local_78,browser);
      if (bVar5) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        goto LAB_0057e064;
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  QByteArray::QByteArray((QByteArray *)&local_78,"KDE",-1);
  bVar5 = operator==(desktop,(QByteArray *)&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
  if (bVar5) {
    local_78.d = (Data *)0x0;
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    local_78.ptr = L"kde-open5";
    local_98.size = 0;
    local_78.size = 9;
    bVar5 = checkExecutable((QString *)&local_78,browser);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    if (bVar5) goto LAB_0057e064;
    local_78.d = (Data *)0x0;
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    local_78.ptr = L"kfmclient";
    local_98.size = 0;
    local_78.size = 9;
    bVar5 = checkExecutable((QString *)&local_78,browser);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    if (bVar5) {
      QString::append((QLatin1String *)browser);
      goto LAB_0057e064;
    }
  }
  else {
    QByteArray::QByteArray((QByteArray *)&local_78,"GNOME",-1);
    bVar5 = operator==(desktop,(QByteArray *)&local_78);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
    if (bVar5) {
      local_78.d = (Data *)0x0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char16_t *)0x0;
      local_78.ptr = L"gnome-open";
      local_98.size = 0;
      local_78.size = 10;
      bVar5 = checkExecutable((QString *)&local_78,browser);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      if (bVar5) goto LAB_0057e064;
    }
  }
  lVar7 = 0;
  do {
    bVar6 = lVar7 != 4;
    if (lVar7 == 4) break;
    QLatin1String::QLatin1String(&local_a8,browsers[lVar7]);
    QString::QString((QString *)&local_78,local_a8);
    bVar5 = checkExecutable((QString *)&local_78,browser);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    lVar7 = lVar7 + 1;
  } while (!bVar5);
LAB_0057e064:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

static inline bool detectWebBrowser(const QByteArray &desktop,
                                    bool checkBrowserVariable,
                                    QString *browser)
{
    const char *browsers[] = {"google-chrome", "firefox", "mozilla", "opera"};

    browser->clear();
    if (checkExecutable(QStringLiteral("xdg-open"), browser))
        return true;

    if (checkBrowserVariable) {
        QString browserVariable = qEnvironmentVariable("DEFAULT_BROWSER");
        if (browserVariable.isEmpty())
            browserVariable = qEnvironmentVariable("BROWSER");
        if (!browserVariable.isEmpty() && checkExecutable(browserVariable, browser))
            return true;
    }

    if (desktop == QByteArray("KDE")) {
        if (checkExecutable(QStringLiteral("kde-open5"), browser))
            return true;
        // Konqueror launcher
        if (checkExecutable(QStringLiteral("kfmclient"), browser)) {
            browser->append(" exec"_L1);
            return true;
        }
    } else if (desktop == QByteArray("GNOME")) {
        if (checkExecutable(QStringLiteral("gnome-open"), browser))
            return true;
    }

    for (size_t i = 0; i < sizeof(browsers)/sizeof(char *); ++i)
        if (checkExecutable(QLatin1StringView(browsers[i]), browser))
            return true;
    return false;
}